

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2608_reset_chip(void *chip)

{
  FM_OPN *OPN;
  double dVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  OPN = (FM_OPN *)((long)chip + 0x208);
  OPNPrescaler_w(OPN,0,2);
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  (**(code **)((long)chip + 0x670))(*(undefined8 *)((long)chip + 0x678));
  YM2608IRQMaskWrite(OPN,(YM2608 *)chip,0x1f);
  YM2608IRQFlagWrite(OPN,(YM2608 *)chip,0x1c);
  *(undefined8 *)((long)chip + 0x6d8) = 0;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  *(undefined4 *)((long)chip + 0x244) = 0;
  *(undefined1 *)((long)chip + 0x69c) = 0;
  *(undefined1 *)((long)chip + 0x22f) = 0;
  *(undefined4 *)((long)chip + 0x230) = 0;
  *(undefined1 *)((long)chip + 0x22d) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  reset_channels((FM_ST *)((long)chip + 0x210),(FM_CH *)((long)chip + 0x4778),6);
  for (uVar3 = 0xb6; 0xb3 < uVar3; uVar3 = uVar3 - 1) {
    OPNWriteReg(OPN,uVar3,0xc0);
    OPNWriteReg(OPN,uVar3 | 0x100,0xc0);
  }
  for (uVar3 = 0xb2; 0x2f < uVar3; uVar3 = uVar3 - 1) {
    OPNWriteReg(OPN,uVar3,0);
    OPNWriteReg(OPN,uVar3 | 0x100,0);
  }
  OPNWriteMode(OPN,0x27,0x30);
  for (uVar3 = 0x26; 0x1f < uVar3; uVar3 = uVar3 - 1) {
    OPNWriteReg(OPN,uVar3,0);
  }
  dVar1 = *(double *)((long)chip + 0x220);
  lVar2 = 0;
  for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
    *(int *)((long)chip + lVar2 * 8 + 0x512c) =
         (int)(long)((double)((float)dVar1 * 65536.0) /
                    *(double *)(&DAT_00162300 + (ulong)(uVar4 < 4) * 8));
    *(undefined8 *)((long)chip + lVar2 * 8 + 0x5130) =
         *(undefined8 *)((long)YM2608_ADPCM_ROM_addr + lVar2);
    *(undefined8 *)((long)chip + lVar2 * 8 + 0x5124) = 0;
    *(undefined1 *)((long)chip + lVar2 * 8 + 0x5148) = 0;
    *(long *)((long)chip + lVar2 * 8 + 0x5150) = (long)chip + 0x4738;
    *(undefined2 *)((long)chip + lVar2 * 8 + 0x5120) = 0;
    *(undefined8 *)((long)chip + lVar2 * 8 + 0x513c) = 0;
    *(undefined4 *)((long)chip + lVar2 * 8 + 0x5144) = 0;
    lVar2 = lVar2 + 8;
  }
  *(undefined1 *)((long)chip + 0x511c) = 0x3f;
  *(undefined1 *)((long)chip + 0x5360) = 0;
  *(undefined8 *)((long)chip + 0x5388) = *(undefined8 *)((long)chip + 0x220);
  YM_DELTAT_ADPCM_Reset((YM_DELTAT *)((long)chip + 0x5368),3);
  return;
}

Assistant:

void ym2608_reset_chip(void *chip)
{
	int i;
	YM2608 *F2608 = (YM2608 *)chip;
	FM_OPN *OPN   = &F2608->OPN;
	YM_DELTAT *DELTAT = &F2608->deltaT;

	/* Reset Prescaler */
	OPNPrescaler_w(OPN , 0 , 2);
	F2608->deltaT.freqbase = OPN->ST.freqbase;
	/* reset SSG section */
	OPN->ST.SSG_funcs.reset(OPN->ST.SSG_param);

	/* status clear */
	FM_BUSY_CLEAR(&OPN->ST);

	/* register 0x29 - default value after reset is:
		enable only 3 FM channels and enable all the status flags */
	YM2608IRQMaskWrite(OPN, F2608, 0x1f );  /* default value for D4-D0 is 1 */

	/* register 0x10, A1=1 - default value is 1 for D4, D3, D2, 0 for the rest */
	YM2608IRQFlagWrite(OPN, F2608, 0x1c );  /* default: enable timer A and B, disable EOS, BRDY and ZERO */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;
	OPN->ST.irq = 0;

	memset(F2608->REGS, 0x00, sizeof(UINT8) * 512);

	reset_channels( &OPN->ST , F2608->CH , 6 );
	/* reset Operator paramater */
	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}
	OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */
	for(i = 0x26 ; i >= 0x20 ; i-- ) OPNWriteReg(OPN,i,0);

	/* ADPCM - percussion sounds */
	for( i = 0; i < 6; i++ )
	{
		if (i<=3)   /* channels 0,1,2,3 */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/3.0);
		else        /* channels 4 and 5 work with slower clock */
			F2608->adpcm[i].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2608->OPN.ST.freqbase)/6.0);

		F2608->adpcm[i].start     = YM2608_ADPCM_ROM_addr[i*2];
		F2608->adpcm[i].end       = YM2608_ADPCM_ROM_addr[i*2+1];

		F2608->adpcm[i].now_addr  = 0;
		F2608->adpcm[i].now_step  = 0;
		// F2608->adpcm[i].delta     = 21866;
		F2608->adpcm[i].vol_mul   = 0;
		F2608->adpcm[i].pan       = &OPN->out_adpcm[OUTD_CENTER]; /* default center */
		F2608->adpcm[i].flagMask  = 0;
		F2608->adpcm[i].flag      = 0;
		F2608->adpcm[i].adpcm_acc = 0;
		F2608->adpcm[i].adpcm_step= 0;
		F2608->adpcm[i].adpcm_out = 0;
	}
	F2608->adpcmTL = 0x3f;

	F2608->adpcm_arrivedEndAddress = 0; /* not used */

	/* DELTA-T unit */
	DELTAT->freqbase = OPN->ST.freqbase;
	YM_DELTAT_ADPCM_Reset(DELTAT,OUTD_CENTER);
}